

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O3

void __thiscall TxOrphanage::LimitOrphans(TxOrphanage *this,uint max_orphans,FastRandomContext *rng)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  time_point tVar7;
  _Base_ptr p_Var8;
  Logger *pLVar9;
  uint64_t uVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  _Self __tmp;
  _Base_ptr p_Var13;
  ulong uVar14;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  uint local_50;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tVar7 = NodeClock::now();
  lVar3 = (long)tVar7.__d.__r / 1000000000;
  if ((this->m_next_sweep).__d.__r <= lVar3) {
    p_Var13 = (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_orphans)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      (this->m_next_sweep).__d.__r = lVar3 + 0x4b0;
    }
    else {
      p_Var11 = (_Base_ptr)(lVar3 + 900);
      local_50 = 0;
      do {
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13);
        p_Var2 = p_Var13[2]._M_right;
        if (lVar3 < (long)p_Var2) {
          if ((long)p_Var2 <= (long)p_Var11) {
            p_Var11 = p_Var2;
          }
        }
        else {
          iVar5 = EraseTx(this,(Wtxid *)(*(long *)(p_Var13 + 2) + 0x59));
          local_50 = local_50 + iVar5;
        }
        p_Var13 = p_Var8;
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      local_3c = local_50;
      (this->m_next_sweep).__d.__r = (rep)((long)&p_Var11[9]._M_parent + 4);
      if (0 < (int)local_50) {
        pLVar9 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar9,TXPACKAGES,Debug);
        if (bVar4) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
          ;
          source_file._M_len = 0x5f;
          logging_function._M_str = "LimitOrphans";
          logging_function._M_len = 0xc;
          LogPrintFormatInternal<int>
                    (logging_function,source_file,0x78,TXPACKAGES,Debug,
                     (ConstevalFormatString<1U>)0xfb0896,(int *)&local_3c);
        }
      }
    }
  }
  if ((ulong)max_orphans < (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    uVar12 = 0;
    do {
      uVar14 = ((long)(this->m_orphan_list).
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_orphan_list).
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      if (uVar14 == 0) {
        uVar6 = 0x40;
      }
      else {
        lVar3 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar6 = (uint)lVar3 ^ 0x3f;
      }
      do {
        uVar10 = RandomMixin<FastRandomContext>::randbits
                           (&rng->super_RandomMixin<FastRandomContext>,0x40 - uVar6);
      } while (uVar14 < uVar10);
      EraseTx(this,(Wtxid *)(*(long *)((this->m_orphan_list).
                                       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_node + 2
                                      ) + 0x59));
      uVar12 = uVar12 + 1;
      local_3c = uVar12;
    } while ((ulong)max_orphans < (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
    if (uVar12 != 0) {
      pLVar9 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar9,TXPACKAGES,Debug);
      if (bVar4) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
        ;
        source_file_00._M_len = 0x5f;
        logging_function_00._M_str = "LimitOrphans";
        logging_function_00._M_len = 0xc;
        LogPrintFormatInternal<unsigned_int>
                  (logging_function_00,source_file_00,0x81,TXPACKAGES,Debug,
                   (ConstevalFormatString<1U>)0xfb08bd,&local_3c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::LimitOrphans(unsigned int max_orphans, FastRandomContext& rng)
{
    unsigned int nEvicted = 0;
    auto nNow{Now<NodeSeconds>()};
    if (m_next_sweep <= nNow) {
        // Sweep out expired orphan pool entries:
        int nErased = 0;
        auto nMinExpTime{nNow + ORPHAN_TX_EXPIRE_TIME - ORPHAN_TX_EXPIRE_INTERVAL};
        std::map<Wtxid, OrphanTx>::iterator iter = m_orphans.begin();
        while (iter != m_orphans.end())
        {
            std::map<Wtxid, OrphanTx>::iterator maybeErase = iter++;
            if (maybeErase->second.nTimeExpire <= nNow) {
                nErased += EraseTx(maybeErase->second.tx->GetWitnessHash());
            } else {
                nMinExpTime = std::min(maybeErase->second.nTimeExpire, nMinExpTime);
            }
        }
        // Sweep again 5 minutes after the next entry that expires in order to batch the linear scan.
        m_next_sweep = nMinExpTime + ORPHAN_TX_EXPIRE_INTERVAL;
        if (nErased > 0) LogDebug(BCLog::TXPACKAGES, "Erased %d orphan tx due to expiration\n", nErased);
    }
    while (m_orphans.size() > max_orphans)
    {
        // Evict a random orphan:
        size_t randompos = rng.randrange(m_orphan_list.size());
        EraseTx(m_orphan_list[randompos]->second.tx->GetWitnessHash());
        ++nEvicted;
    }
    if (nEvicted > 0) LogDebug(BCLog::TXPACKAGES, "orphanage overflow, removed %u tx\n", nEvicted);
}